

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali-query.cpp
# Opt level: O1

void setup_caliper_config(Args *args)

{
  bool bVar1;
  string local_38;
  
  cali_config_preset("CALI_LOG_VERBOSITY","0");
  cali_config_preset("CALI_CALIPER_ATTRIBUTE_DEFAULT_SCOPE","process");
  cali_config_allow_read_env(0);
  cali_config_set("CALI_CONFIG_FILE","cali-query_caliper.config");
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"verbose","");
  bVar1 = cali::util::Args::is_set(args,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    cali_config_preset("CALI_LOG_VERBOSITY","1");
  }
  return;
}

Assistant:

void setup_caliper_config(const Args& args)
{
    //   Configure the default config, which can be provided by the user through
    // the "cali-query_caliper.config" file or the "caliper-config" command line arg

    cali_config_preset("CALI_LOG_VERBOSITY", "0");
    cali_config_preset("CALI_CALIPER_ATTRIBUTE_DEFAULT_SCOPE", "process");

    cali_config_allow_read_env(false);
    cali_config_set("CALI_CONFIG_FILE", "cali-query_caliper.config");

    if (args.is_set("verbose"))
        cali_config_preset("CALI_LOG_VERBOSITY", "1");
}